

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileInstaller::CheckKeyword(cmFileInstaller *this,string *arg)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream e;
  string *arg_local;
  cmFileInstaller *this_local;
  
  bVar1 = std::operator==(arg,"TYPE");
  if (bVar1) {
    if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
      (this->super_cmFileCopier).Doing = 9;
    }
    else {
      cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
    }
  }
  else {
    bVar1 = std::operator==(arg,"FILES");
    if (bVar1) {
      if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
        (this->super_cmFileCopier).Doing = 3;
      }
      else {
        cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
      }
    }
    else {
      bVar1 = std::operator==(arg,"RENAME");
      if (bVar1) {
        if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
          (this->super_cmFileCopier).Doing = 10;
        }
        else {
          cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
        }
      }
      else {
        bVar1 = std::operator==(arg,"OPTIONAL");
        if (bVar1) {
          if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
            (this->super_cmFileCopier).Doing = 0;
            this->Optional = true;
          }
          else {
            cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
          }
        }
        else {
          bVar1 = std::operator==(arg,"MESSAGE_ALWAYS");
          if (bVar1) {
            if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
              (this->super_cmFileCopier).Doing = 0;
              this->MessageAlways = true;
            }
            else {
              cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
            }
          }
          else {
            bVar1 = std::operator==(arg,"MESSAGE_LAZY");
            if (bVar1) {
              if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                (this->super_cmFileCopier).Doing = 0;
                this->MessageLazy = true;
              }
              else {
                cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
              }
            }
            else {
              bVar1 = std::operator==(arg,"MESSAGE_NEVER");
              if (bVar1) {
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 0;
                  this->MessageNever = true;
                }
                else {
                  cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
                }
              }
              else {
                bVar1 = std::operator==(arg,"PERMISSIONS");
                if (bVar1) {
                  if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                    (this->super_cmFileCopier).Doing = 6;
                    (this->super_cmFileCopier).UseGivenPermissionsFile = true;
                  }
                  else {
                    (this->super_cmFileCopier).Doing = 8;
                  }
                }
                else {
                  bVar1 = std::operator==(arg,"DIR_PERMISSIONS");
                  if (bVar1) {
                    if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                      (this->super_cmFileCopier).Doing = 7;
                      (this->super_cmFileCopier).UseGivenPermissionsDir = true;
                    }
                    else {
                      cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
                    }
                  }
                  else {
                    bVar1 = std::operator==(arg,"COMPONENTS");
                    if (((!bVar1) && (bVar1 = std::operator==(arg,"CONFIGURATIONS"), !bVar1)) &&
                       (bVar1 = std::operator==(arg,"PROPERTIES"), !bVar1)) {
                      bVar1 = cmFileCopier::CheckKeyword(&this->super_cmFileCopier,arg);
                      return bVar1;
                    }
                    std::__cxx11::ostringstream::ostringstream(local_198);
                    poVar2 = std::operator<<((ostream *)local_198,"INSTALL called with old-style ");
                    poVar2 = std::operator<<(poVar2,(string *)arg);
                    poVar2 = std::operator<<(poVar2," argument.  ");
                    poVar2 = std::operator<<(poVar2,
                                             "This script was generated with an older version of CMake.  "
                                            );
                    std::operator<<(poVar2,"Re-run this cmake version on your build tree.");
                    this_00 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(this_00,&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    (this->super_cmFileCopier).Doing = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_198);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFileInstaller::CheckKeyword(std::string const& arg)
{
  if(arg == "TYPE")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingType;
      }
    }
  else if(arg == "FILES")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingFiles;
      }
    }
  else if(arg == "RENAME")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingRename;
      }
    }
  else if(arg == "OPTIONAL")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->Optional = true;
      }
    }
  else if(arg == "MESSAGE_ALWAYS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->MessageAlways = true;
      }
    }
  else if(arg == "MESSAGE_LAZY")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->MessageLazy = true;
      }
    }
  else if(arg == "MESSAGE_NEVER")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->MessageNever = true;
      }
    }
  else if(arg == "PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->Doing = DoingPermissionsMatch;
      }
    else
      {
      // file(INSTALL) aliases PERMISSIONS to FILE_PERMISSIONS
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
      }
    }
  else if(arg == "DIR_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      // file(INSTALL) aliases DIR_PERMISSIONS to DIRECTORY_PERMISSIONS
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
      }
    }
  else if(arg == "COMPONENTS" || arg == "CONFIGURATIONS" ||
          arg == "PROPERTIES")
    {
    std::ostringstream e;
    e << "INSTALL called with old-style " << arg << " argument.  "
      << "This script was generated with an older version of CMake.  "
      << "Re-run this cmake version on your build tree.";
    this->FileCommand->SetError(e.str());
    this->Doing = DoingError;
    }
  else
    {
    return this->cmFileCopier::CheckKeyword(arg);
    }
  return true;
}